

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# balk.cpp
# Opt level: O0

void __thiscall Balk::save_result(Balk *this,string *folder_name,size_t num_of_points)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference __source;
  __shared_ptr_access<Term,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar4;
  reference pvVar5;
  ostream *this_01;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3a8;
  shared_ptr<Term> *el;
  iterator __end3;
  iterator __begin3;
  vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_> *__range3;
  double dStack_328;
  int ind;
  double res;
  basic_ofstream<char,_std::char_traits<char>_> local_318 [4];
  int i;
  ofstream file;
  undefined1 local_118 [8];
  path p;
  int num;
  allocator<char> local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  iterator local_48;
  size_type local_40;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  size_t num_of_points_local;
  string *folder_name_local;
  Balk *this_local;
  
  num._0_1_ = 1;
  local_d0 = &local_c8;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)num_of_points;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"out1.txt",&local_d1);
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a8,"out2.txt",(allocator<char> *)((long)&num + 3));
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"out3.txt",(allocator<char> *)((long)&num + 2));
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,"out4.txt",(allocator<char> *)((long)&num + 1));
  num._0_1_ = 0;
  local_48 = &local_c8;
  local_40 = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&p.field_0x27);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_38,__l,(allocator_type *)&p.field_0x27);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&p.field_0x27);
  local_3a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48;
  do {
    local_3a8 = local_3a8 + -1;
    std::__cxx11::string::~string((string *)local_3a8);
  } while (local_3a8 != &local_c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&num + 1));
  std::allocator<char>::~allocator((allocator<char> *)((long)&num + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&num + 3));
  std::allocator<char>::~allocator(&local_d1);
  p._M_cmpts = (_List)0x0;
  p._33_3_ = 0;
  while( true ) {
    uVar2 = (ulong)(int)p._32_4_;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_38);
    if (sVar3 <= uVar2) break;
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)local_118,folder_name,auto_format);
    __source = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_38,(long)(int)p._32_4_);
    std::filesystem::__cxx11::path::operator/=((path *)local_118,__source);
    std::ofstream::ofstream(local_318);
    std::basic_ofstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
              (local_318,(path *)local_118,_S_out);
    for (res._4_4_ = 0;
        (pointer)(long)res._4_4_ <
        outputs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage; res._4_4_ = res._4_4_ + 1) {
      dStack_328 = 0.0;
      __range3._4_4_ = 0;
      __end3 = std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::begin
                         (&this->terms);
      el = (shared_ptr<Term> *)
           std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::end
                     (&this->terms);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<std::shared_ptr<Term>_*,_std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>_>
                                    *)&el);
        if (!bVar1) break;
        this_00 = (__shared_ptr_access<Term,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  __gnu_cxx::
                  __normal_iterator<std::shared_ptr<Term>_*,_std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>_>
                  ::operator*(&__end3);
        peVar4 = std::__shared_ptr_access<Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(this_00);
        bVar1 = Term::isUnknown(peVar4);
        if (bVar1) {
          peVar4 = std::__shared_ptr_access<Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(this_00);
          auVar8._8_4_ = (int)((ulong)outputs.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
          auVar8._0_8_ = outputs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          auVar8._12_4_ = 0x45300000;
          (*peVar4->_vptr_Term[2])
                    (((double)(res._4_4_ * this->balk_size) * this->segment_length) /
                     ((auVar8._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,
                                       (int)outputs.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage) -
                     4503599627370496.0)),peVar4,(ulong)(uint)p._32_4_);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&this->x,(long)__range3._4_4_);
          dVar6 = extraout_XMM0_Qa_00 * *pvVar5;
          __range3._4_4_ = __range3._4_4_ + 1;
        }
        else {
          peVar4 = std::__shared_ptr_access<Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(this_00);
          auVar7._8_4_ = (int)((ulong)outputs.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
          auVar7._0_8_ = outputs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          auVar7._12_4_ = 0x45300000;
          (*peVar4->_vptr_Term[2])
                    (((double)(res._4_4_ * this->balk_size) * this->segment_length) /
                     ((auVar7._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,
                                       (int)outputs.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage) -
                     4503599627370496.0)),peVar4,(ulong)(uint)p._32_4_);
          dVar6 = extraout_XMM0_Qa;
        }
        dStack_328 = dVar6 + dStack_328;
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<Term>_*,_std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>_>
        ::operator++(&__end3);
      }
      if ((int)p._32_4_ < 2) {
        dStack_328 = dStack_328 / (this->E * this->J);
      }
      this_01 = (ostream *)std::ostream::operator<<((ostream *)local_318,dStack_328);
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    }
    std::ofstream::close();
    std::ofstream::~ofstream(local_318);
    std::filesystem::__cxx11::path::~path((path *)local_118);
    p._32_4_ = p._32_4_ + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  return;
}

Assistant:

void Balk::save_result(const std::string &folder_name, size_t num_of_points)
{
    std::vector<std::string> outputs = {"out1.txt", "out2.txt", "out3.txt", "out4.txt"};
    for (int num = 0; num < outputs.size(); ++num)
    {
        std::filesystem::path p = folder_name;
        p /= outputs[num];
        std::ofstream file;
        file.open(p);

        for (int i = 0; i < num_of_points; ++i)
        {
            double res = 0;
            int ind = 0;
            for (const auto &el : terms)
            {
                if (!(el->isUnknown()))
                {
                    res += el->calculate(i * balk_size * segment_length / num_of_points, num);
                }
                else
                {
                    res += el->calculate(i * balk_size * segment_length / num_of_points, num) * x[ind++];
                }
            }
            if (num <= 1) 
            {
                res /= (E * J);
            }
            file << res << std::endl;
        }
        file.close();
    }
}